

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O1

ON_wString __thiscall
ON_wString::FormatToVulgarFraction
          (ON_wString *this,int numerator,int denominator,bool bReduced,bool bProper,
          uint proper_fraction_separator_cp,bool bUseVulgarFractionCodePoints)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ON_wString *this_00;
  ulong uVar8;
  ON__UINT32 u;
  bool bVar9;
  ON_wString fraction;
  ON_wString vulgar_fraction;
  ON__UINT32 code_point;
  ON_wString local_90;
  ON_wString local_88;
  ON_wString local_80;
  ON_wString local_78;
  undefined4 local_70;
  ON_wString local_68;
  ON_wString local_60;
  ON_wString local_58;
  ON_wString local_50;
  ON_wString local_48;
  ON_wString local_40;
  ON_wString local_38;
  
  if (denominator == 0) {
    FormatToString((wchar_t *)&local_40,L"%d",(ulong)(uint)numerator);
    ON_wString(&local_48,L"0");
    FormatToVulgarFraction(this,&local_40,&local_48);
    ~ON_wString(&local_48);
    this_00 = &local_40;
    goto LAB_00684a8d;
  }
  if (numerator == 0) {
    if (bReduced) {
      ON_wString(this,L"0");
      return (ON_wString)(wchar_t *)this;
    }
    ON_wString(&local_50,L"0");
    FormatToString((wchar_t *)&local_58,L"%d",(ulong)(uint)denominator);
    FormatToVulgarFraction(this,&local_50,&local_58);
    ~ON_wString(&local_58);
    this_00 = &local_50;
    goto LAB_00684a8d;
  }
  if (bReduced) {
    if (denominator < 0) {
LAB_00684699:
      denominator = -denominator;
      numerator = -numerator;
    }
  }
  else if (denominator < 0 && bProper) goto LAB_00684699;
  if (bReduced) {
    uVar3 = -numerator;
    if (0 < numerator) {
      uVar3 = numerator;
    }
    uVar4 = -denominator;
    if (0 < denominator) {
      uVar4 = denominator;
    }
    if (((1 < uVar3) && (1 < uVar4)) &&
       (uVar3 = ON_GreatestCommonDivisor(uVar3,denominator), 0 < (int)uVar3)) {
      numerator = numerator / (int)uVar3;
      denominator = denominator / (int)uVar3;
    }
  }
  uVar3 = -numerator;
  if (0 < numerator) {
    uVar3 = numerator;
  }
  code_point = 0;
  if ((bProper) && (denominator <= (int)uVar3)) {
    uVar1 = (long)numerator / (long)denominator;
    uVar2 = (long)numerator % (long)denominator;
    code_point = (ON__UINT32)uVar1;
    iVar5 = (int)uVar2;
    uVar8 = (ulong)(uint)-iVar5;
    if (0 < iVar5) {
      uVar8 = uVar2 & 0xffffffff;
    }
    if (numerator == code_point * denominator) {
      FormatToString((wchar_t *)this,L"%d",uVar1 & 0xffffffff);
      return (ON_wString)(wchar_t *)this;
    }
    if (proper_fraction_separator_cp != 0) {
      ON_IsValidUnicodeCodePoint(proper_fraction_separator_cp);
    }
  }
  else {
    uVar8 = (ulong)(uint)numerator;
  }
  uVar3 = (uint)uVar8;
  if (!bUseVulgarFractionCodePoints) goto LAB_006849a4;
  uVar4 = -uVar3;
  if (0 < (int)uVar3) {
    uVar4 = uVar3;
  }
  uVar6 = -denominator;
  if (0 < denominator) {
    uVar6 = denominator;
  }
  if (uVar6 <= uVar4) goto LAB_006849a4;
  switch(denominator) {
  case 2:
    u = 0xbd;
    goto LAB_006848ca;
  case 3:
    bVar9 = true;
    if (uVar3 == 1) {
      u = 0x2153;
    }
    else {
      if (uVar3 != 2) goto switchD_006847d8_default;
      u = 0x2154;
    }
    break;
  case 4:
    bVar9 = true;
    if (uVar3 == 1) {
      u = 0xbc;
    }
    else {
      if (uVar3 != 3) goto switchD_006847d8_default;
      u = 0xbe;
    }
    break;
  case 5:
    bVar9 = true;
    switch(uVar3) {
    case 1:
      u = 0x2155;
      break;
    case 2:
      u = 0x2156;
      break;
    case 3:
      u = 0x2157;
      break;
    case 4:
      u = 0x2158;
      break;
    default:
      goto switchD_006847d8_default;
    }
    break;
  case 6:
    bVar9 = true;
    if (uVar3 == 1) {
      u = 0x2159;
    }
    else {
      if (uVar3 != 5) goto switchD_006847d8_default;
      u = 0x215a;
    }
    break;
  case 7:
    u = 0x2150;
    goto LAB_006848ca;
  case 8:
    bVar9 = true;
    switch(uVar3) {
    case 1:
      u = 0x215b;
      break;
    default:
      goto switchD_006847d8_default;
    case 3:
      u = 0x215c;
      break;
    case 5:
      u = 0x215d;
      break;
    case 7:
      u = 0x215e;
    }
    break;
  case 9:
    u = 0x2151;
    goto LAB_006848ca;
  case 10:
    u = 0x2152;
LAB_006848ca:
    bVar9 = uVar3 == 1;
    if (!bVar9) {
      u = 0;
    }
    break;
  default:
switchD_006847d8_default:
    bVar9 = false;
    u = 0;
  }
  if ((bVar9) && (iVar5 = ON_IsValidUnicodeCodePoint(u), iVar5 != 0)) {
    local_70 = 0;
    local_78.m_s = (wchar_t *)0x0;
    lVar7 = 0;
    if ((code_point == 0) && ((int)uVar3 < 0)) {
      local_78.m_s = (wchar_t *)0x2d;
      lVar7 = 1;
    }
    *(ON__UINT32 *)((long)&local_78.m_s + lVar7 * 4) = u;
    FromUnicodeCodePoints(&local_90,(ON__UINT32 *)&local_78,(int)lVar7 + 1,0xfffd);
    if (code_point == 0) {
      ON_wString(this,&local_90);
    }
    else {
      FormatToString((wchar_t *)&local_88,L"%d");
      FromUnicodeCodePoint(code_point);
      operator+(&local_80,&local_88);
      operator+(this,&local_80);
      ~ON_wString(&local_80);
      ~ON_wString(&local_60);
      ~ON_wString(&local_88);
    }
    this_00 = &local_90;
  }
  else {
LAB_006849a4:
    FormatToString((wchar_t *)&local_38,L"%d",uVar8);
    FormatToString((wchar_t *)&local_68,L"%d",(ulong)(uint)denominator);
    FormatToVulgarFraction(&local_78,&local_38,&local_68);
    uVar3 = code_point;
    ~ON_wString(&local_68);
    ~ON_wString(&local_38);
    if (code_point == 0) {
      ON_wString(this,&local_78);
    }
    else {
      FormatToString((wchar_t *)&local_80,L"%d",(ulong)code_point);
      FromUnicodeCodePoint(uVar3);
      operator+(&local_90,&local_80);
      operator+(this,&local_90);
      ~ON_wString(&local_90);
      ~ON_wString(&local_88);
      ~ON_wString(&local_80);
    }
    this_00 = &local_78;
  }
LAB_00684a8d:
  ~ON_wString(this_00);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_wString::FormatToVulgarFraction(
  int numerator,
  int denominator,
  bool bReduced,
  bool bProper,
  unsigned proper_fraction_separator_cp,
  bool bUseVulgarFractionCodePoints
)
{
  if (0 == denominator)
  {
    // ... Kids these days!
    return ON_wString::FormatToVulgarFraction(ON_wString::FormatToString(L"%d", numerator), L"0");
  }

  if (0 == numerator)
  {
    if (bReduced)
      return ON_wString(L"0");
    if (bUseVulgarFractionCodePoints && 3 == numerator)
      return ON_wString((wchar_t)0x2189); // Baseball zero for three 0/3 = U+2189

    return ON_wString::FormatToVulgarFraction(L"0", ON_wString::FormatToString(L"%d", denominator));
  }

  if (bReduced || bProper)
  {
    if (denominator < 0)
    {
      denominator = -denominator;
      numerator = -numerator;
    }
  }

  if (bReduced && abs(numerator) > 1 && abs(denominator) > 1)
  {
    const int gcd = (int)ON_GreatestCommonDivisor((unsigned)(abs(numerator)), (unsigned)denominator);
    if (gcd > 0)
    {
      numerator /= gcd;
      denominator /= gcd;
    }
  }

  int n = 0;
  if (bProper && abs(numerator) >= denominator)
  {
    n = numerator / denominator;
    numerator = abs(numerator - (n * denominator));
    if (0 == numerator)
      return ON_wString::FormatToString(L"%d", n);

    if (0 != proper_fraction_separator_cp && false == ON_IsValidUnicodeCodePoint(proper_fraction_separator_cp))
      proper_fraction_separator_cp = 0;
  }

  if (bUseVulgarFractionCodePoints && abs(numerator) < abs(denominator))
  {
    unsigned fraction_cp = 0;
    switch (denominator)
    {
    case 2:
      if (1 == numerator)
        fraction_cp = 0x00BD;
      break;
    case 3:
      if (1 == numerator)
        fraction_cp = 0x2153;
      else if (2 == numerator)
        fraction_cp = 0x2154;
      break;
    case 4:
      if (1 == numerator)
        fraction_cp = 0x00BC;
      else if (3 == numerator)
        fraction_cp = 0x00BE;
      break;
    case 5:
      if (1 == numerator)
        fraction_cp = 0x2155;
      else if (2 == numerator)
        fraction_cp = 0x2156;
      else if (3 == numerator)
        fraction_cp = 0x2157;
      else if (4 == numerator)
        fraction_cp = 0x2158;
      break;
    case 6:
      if (1 == numerator)
        fraction_cp = 0x2159;
      else if (5 == numerator)
        fraction_cp = 0x215A;
      break;
    case 7:
      if (1 == numerator)
        fraction_cp = 0x2150;
      break;
    case 8:
      if (1 == numerator)
        fraction_cp = 0x215B;
      else if (3 == numerator)
        fraction_cp = 0x215C;
      else if (5 == numerator)
        fraction_cp = 0x215D;
      else if (7 == numerator)
        fraction_cp = 0x215E;
      break;
    case 9:
      if (1 == numerator)
        fraction_cp = 0x2151;
      break;
    case 10:
      if (1 == numerator)
        fraction_cp = 0x2152;
      break;
    }

    if (fraction_cp > 0 && ON_IsValidUnicodeCodePoint(fraction_cp))
    {
      unsigned cp[3] = {};
      unsigned cp_count = 0;
      if (0 == n && numerator < 0)
        cp[cp_count++] = ON_UnicodeCodePoint::ON_HyphenMinus;
      cp[cp_count++] = fraction_cp;
      const ON_wString fraction = ON_wString::FromUnicodeCodePoints(cp, cp_count, ON_UnicodeCodePoint::ON_ReplacementCharacter);
      if (0 == n)
        return fraction;
      return ON_wString::FormatToString(L"%d", n)
        + ON_wString::FromUnicodeCodePoint(proper_fraction_separator_cp)
        + fraction;
    }
  }

  const ON_wString vulgar_fraction = ON_wString::FormatToVulgarFraction(ON_wString::FormatToString(L"%d", numerator), ON_wString::FormatToString(L"%d", denominator));
  return
    (0 == n)
    ? vulgar_fraction
    : ON_wString::FormatToString(L"%d", n) + ON_wString::FromUnicodeCodePoint(proper_fraction_separator_cp) + vulgar_fraction;
}